

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CopyNodes
          (TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *this,Node *nodes,
          hash_t numnodes)

{
  undefined8 in_RAX;
  Node *pNVar1;
  FName *pFVar2;
  undefined8 uStack_28;
  
  if (numnodes != 0) {
    pFVar2 = &(nodes->Pair).Value;
    uStack_28 = in_RAX;
    do {
      if (*(long *)(pFVar2 + -3) != 1) {
        uStack_28 = CONCAT44((((IPair *)(pFVar2 + -1))->Key).Index,(undefined4)uStack_28);
        pNVar1 = NewKey(this,(FName *)((long)&uStack_28 + 4));
        (pNVar1->Pair).Value.Index = pFVar2->Index;
      }
      numnodes = numnodes - 1;
      pFVar2 = pFVar2 + 4;
    } while (numnodes != 0);
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}